

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O1

void __thiscall
WSNTopologyBasedEnergy::WSNTopologyBasedEnergy(WSNTopologyBasedEnergy *this,TransportType type)

{
  WSNNode *this_00;
  long lVar1;
  WSNNode *pWVar2;
  WSNNode local_b8;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  cv::Mat::Mat(&this->img);
  this_00 = &this->sink;
  WSNNode::WSNNode(this_00);
  pWVar2 = this->node;
  lVar1 = 0;
  do {
    WSNNode::WSNNode(pWVar2);
    lVar1 = lVar1 + -0x38;
    pWVar2 = pWVar2 + 1;
  } while (lVar1 != -0x15e0);
  pWVar2 = this->LayerFirstLinkNode;
  lVar1 = 0;
  do {
    WSNNode::WSNNode(pWVar2);
    lVar1 = lVar1 + -0x38;
    pWVar2 = pWVar2 + 1;
  } while (lVar1 != -0x118);
  this->layer[4].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->layer[4].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->layer[3].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->layer[3].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->layer[2].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->layer[3].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->layer[2].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->layer[2].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->layer[1].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->layer[1].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->layer[0].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->layer[1].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->layer[0].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->layer[0].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar1 = 0;
  this->layer[4].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->LayerLeaderSeq[0].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->LayerLeaderSeq[0].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->LayerLeaderSeq[0].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->LayerLeaderSeq[1].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->LayerLeaderSeq[1].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->LayerLeaderSeq[1].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->LayerLeaderSeq[2].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->LayerLeaderSeq[2].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->LayerLeaderSeq[2].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->LayerLeaderSeq[3].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->LayerLeaderSeq[3].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->LayerLeaderSeq[3].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->LayerLeaderSeq[4].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->LayerLeaderSeq[4].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->LayerLeaderSeq[4].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pWVar2 = this->LayerLeaderNode;
  do {
    WSNNode::WSNNode(pWVar2);
    lVar1 = lVar1 + -0x38;
    pWVar2 = pWVar2 + 1;
  } while (lVar1 != -0x118);
  this->type_ = (char)type;
  local_58 = 0x406fe00000000000;
  uStack_50 = 0x406fe00000000000;
  local_48 = 0x406fe00000000000;
  uStack_40 = 0;
  cv::Mat::Mat((Mat *)&local_b8,600,600,0x10,(Scalar_ *)&local_58);
  cv::Mat::operator=(&this->img,(Mat *)&local_b8);
  cv::Mat::~Mat((Mat *)&local_b8);
  this->Test = true;
  lVar1 = 0;
  WSNNode::WSNNode(&local_b8,0,0);
  (this->sink).leaderID = local_b8.leaderID;
  (this->sink).id = local_b8.id;
  this_00->x = local_b8.x;
  this_00->y = local_b8.y;
  (this->sink).energy = local_b8.energy;
  (this->sink).color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
       local_b8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
  (this->sink).color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
       local_b8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
  (this->sink).color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
       local_b8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
  (this->sink).color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
       local_b8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
  WSNNode::~WSNNode(&local_b8);
  this->alpha = 1.4e-05;
  this->TopLayer = 0;
  this->ENERGY = 100.0;
  this->NetThresEnergy = 75.0;
  this->Mark[0] = 0;
  this->Mark[1] = 0;
  this->Mark[2] = 0;
  this->Mark[3] = 0;
  this->Mark[4] = 0;
  do {
    this->ThresEnergy[lVar1] = 75.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

WSNTopologyBasedEnergy::WSNTopologyBasedEnergy(TransportType type){
	type_ = type;
	img = Mat(600,600,CV_8UC3,Scalar(255,255,255));
	//是否测试
	Test= true;
	//汇聚节点
	sink=WSNNode(0,0);
	//能量传送系数
	alpha = 0.000014;
	//直接与sink节点通信的层号
	TopLayer=0;
	//节点能量初始值
	ENERGY=100;
	//整个网络的能力阈值
	NetThresEnergy=75;
	for(int i=0;i<LayerNum;i++){
		//标记
		Mark[i]=0;
		//每层的能量阈值
		ThresEnergy[i]=75;
	}
}